

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O2

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
max_by_function::evaluate
          (max_by_function *this,
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          *args,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *context,error_code *ec)

{
  pointer ppVar1;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_00;
  expression_type *peVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  type_conflict9 tVar6;
  int iVar7;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar8;
  undefined4 extraout_var;
  size_t sVar9;
  undefined4 extraout_var_00;
  reference pbVar10;
  assertion_error *this_01;
  ulong i;
  size_t local_68;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> key1;
  error_code ec2;
  
  ppVar1 = (args->
           super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4 !=
      (this->
      super_function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      ).arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value) {
    this_01 = (assertion_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ec2,"assertion \'args.size() == *this->arity()\' failed at  <> :0",
               (allocator<char> *)&key1);
    assertion_error::assertion_error(this_01,(string *)&ec2);
    __cxa_throw(this_01,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((ppVar1->type_ == value) && (ppVar1[1].type_ == expression)) {
    this_00 = (ppVar1->field_1).value_;
    bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array(this_00);
    if (bVar3) {
      bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::empty(this_00);
      if (!bVar3) {
        peVar2 = (args->
                 super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[1].field_1.expression_;
        ec2._M_value = 0;
        ec2._M_cat = (error_category *)std::_V2::system_category();
        pbVar8 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(this_00,0);
        iVar7 = (*peVar2->_vptr_expr_base[2])(peVar2,pbVar8,context,&ec2);
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
                  (&key1,(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         CONCAT44(extraout_var,iVar7));
        bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number(&key1);
        bVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string(&key1);
        if (bVar3 || bVar4) {
          i = 1;
          local_68 = 0;
          while( true ) {
            sVar9 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(this_00);
            if (sVar9 <= i) break;
            pbVar8 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(this_00,i)
            ;
            iVar7 = (*peVar2->_vptr_expr_base[2])(peVar2,pbVar8,context,&ec2);
            pbVar8 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     CONCAT44(extraout_var_00,iVar7);
            bVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number
                              (pbVar8);
            if (bVar3 != bVar5) {
LAB_002c9d55:
              std::error_code::operator=(ec,invalid_type);
              pbVar10 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                        ::null_value(context);
              goto LAB_002c9d77;
            }
            bVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                              (pbVar8);
            if (bVar4 != bVar5) goto LAB_002c9d55;
            tVar6 = operator>(pbVar8,&key1);
            if (tVar6) {
              basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::operator=
                        (&key1,pbVar8);
              local_68 = i;
            }
            i = i + 1;
          }
          pbVar10 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                              (this_00,local_68);
        }
        else {
          std::error_code::operator=(ec,invalid_type);
          pbVar10 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    ::null_value(context);
        }
LAB_002c9d77:
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json(&key1);
        return pbVar10;
      }
      goto LAB_002c9d2a;
    }
  }
  std::error_code::operator=(ec,invalid_type);
LAB_002c9d2a:
  pbVar10 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
            ::null_value(context);
  return pbVar10;
}

Assistant:

reference evaluate(const std::vector<parameter_type>& args, eval_context<Json>& context, std::error_code& ec) const override
            {
                JSONCONS_ASSERT(args.size() == *this->arity());

                if (!(args[0].is_value() && args[1].is_expression()))
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                reference arg0 = args[0].value();
                if (!arg0.is_array())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }
                if (arg0.empty())
                {
                    return context.null_value();
                }

                const auto& expr = args[1].expression();

                std::error_code ec2;
                Json key1 = expr.evaluate(arg0.at(0), context, ec2); 

                bool is_number = key1.is_number();
                bool is_string = key1.is_string();
                if (!(is_number || is_string))
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                std::size_t index = 0;
                for (std::size_t i = 1; i < arg0.size(); ++i)
                {
                    reference key2 = expr.evaluate(arg0.at(i), context, ec2); 
                    if (!(key2.is_number() == is_number && key2.is_string() == is_string))
                    {
                        ec = jmespath_errc::invalid_type;
                        return context.null_value();
                    }
                    if (key2 > key1)
                    {
                        key1 = key2;
                        index = i;
                    }
                }

                return arg0.at(index);
            }